

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::add_include_once(CTcTokenizer *this,char *fname)

{
  int iVar1;
  size_t sVar2;
  tctok_incfile_t *ptVar3;
  tctok_incfile_t **pptVar4;
  
  pptVar4 = &this->prev_includes_;
  ptVar3 = (tctok_incfile_t *)pptVar4;
  do {
    ptVar3 = ptVar3->nxt;
    if (ptVar3 == (tctok_incfile_t *)0x0) {
      sVar2 = strlen(fname);
      ptVar3 = (tctok_incfile_t *)malloc(sVar2 + 0x10);
      strcpy(ptVar3->fname,fname);
      ptVar3->nxt = *pptVar4;
      *pptVar4 = ptVar3;
      return;
    }
    iVar1 = os_file_names_equal(fname,ptVar3->fname);
  } while (iVar1 == 0);
  return;
}

Assistant:

void CTcTokenizer::add_include_once(const char *fname)
{
    tctok_incfile_t *prvinc;

    /* if the file is already in the list, don't add it again */
    if (find_include_once(fname))
        return;
    
    /* create a new entry for the filename */
    prvinc = (tctok_incfile_t *)t3malloc(sizeof(tctok_incfile_t)
                                         + strlen(fname));

    /* save the filename */
    strcpy(prvinc->fname, fname);
    
    /* link the new entry into our list */
    prvinc->nxt = prev_includes_;
    prev_includes_ = prvinc;
}